

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculation.c
# Opt level: O0

void fill_unknown_vector(double *G,double *V,double *unknown_vector,uint space_nodes)

{
  uint local_28;
  uint space_step;
  uint space_nodes_local;
  double *unknown_vector_local;
  double *V_local;
  double *G_local;
  
  for (local_28 = 0; local_28 < space_nodes; local_28 = local_28 + 1) {
    unknown_vector[local_28 << 1] = G[local_28];
    unknown_vector[local_28 * 2 + 1] = V[local_28];
  }
  return;
}

Assistant:

void fill_unknown_vector (
    double * G,
    double * V,
    double * unknown_vector,
    unsigned space_nodes) {

  register unsigned space_step = 0;
  for (space_step = 0; space_step < space_nodes; ++space_step) {
    unknown_vector[G_INDEX(space_step)] = G[space_step];
    unknown_vector[V_INDEX(space_step)] = V[space_step];
  }
  return;
}